

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglplatformcontext.cpp
# Opt level: O1

bool __thiscall
QEGLPlatformContext::makeCurrent(QEGLPlatformContext *this,QPlatformSurface *surface)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  EGLContext pvVar4;
  EGLDisplay pvVar5;
  long lVar6;
  bool bVar7;
  long in_FS_OFFSET;
  bool intervalOk;
  char local_59;
  QSurfaceFormat local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  long lVar3;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  eglBindAPI(this->m_api);
  iVar2 = (*(this->super_QPlatformOpenGLContext)._vptr_QPlatformOpenGLContext[0x11])(this,surface);
  lVar3 = CONCAT44(extraout_var,iVar2);
  pvVar4 = (EGLContext)eglGetCurrentContext();
  if ((((pvVar4 == this->m_eglContext) &&
       (pvVar5 = (EGLDisplay)eglGetCurrentDisplay(), pvVar5 == this->m_eglDisplay)) &&
      (lVar6 = eglGetCurrentSurface(0x305a), lVar6 == lVar3)) &&
     (lVar6 = eglGetCurrentSurface(0x3059), lVar6 == lVar3)) {
    bVar7 = true;
  }
  else {
    iVar2 = eglMakeCurrent(this->m_eglDisplay,lVar3,lVar3,this->m_eglContext);
    if (iVar2 == 0) {
      makeCurrent();
      bVar7 = false;
    }
    else {
      if (this->m_swapIntervalEnvChecked == false) {
        this->m_swapIntervalEnvChecked = true;
        cVar1 = qEnvironmentVariableIsSet("QT_QPA_EGLFS_SWAPINTERVAL");
        if (cVar1 != '\0') {
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          local_58.d = (QSurfaceFormatPrivate *)&DAT_aaaaaaaaaaaaaaaa;
          puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
          qgetenv((char *)&local_58);
          local_59 = -0x56;
          iVar2 = QByteArray::toInt((bool *)&local_58,(int)&local_59);
          if (local_59 == '\x01') {
            this->m_swapIntervalFromEnv = iVar2;
          }
          if (local_58.d != (QSurfaceFormatPrivate *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&(local_58.d)->ref)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&(local_58.d)->ref)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&(local_58.d)->ref)->_q_value).super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate((QArrayData *)local_58.d,1,0x10);
            }
          }
        }
      }
      iVar2 = this->m_swapIntervalFromEnv;
      if (iVar2 < 0) {
        (*surface->_vptr_QPlatformSurface[2])(&local_58,surface);
        iVar2 = QSurfaceFormat::swapInterval(&local_58);
        QSurfaceFormat::~QSurfaceFormat(&local_58);
      }
      bVar7 = true;
      if (((-1 < iVar2) && (this->m_swapInterval != iVar2)) &&
         (this->m_swapInterval = iVar2, lVar3 != 0)) {
        eglSwapInterval(this->m_eglDisplay,iVar2);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool QEGLPlatformContext::makeCurrent(QPlatformSurface *surface)
{
    Q_ASSERT(surface->surface()->supportsOpenGL());

    eglBindAPI(m_api);

    EGLSurface eglSurface = eglSurfaceForPlatformSurface(surface);

    // shortcut: on some GPUs, eglMakeCurrent is not a cheap operation
    if (eglGetCurrentContext() == m_eglContext &&
        eglGetCurrentDisplay() == m_eglDisplay &&
        eglGetCurrentSurface(EGL_READ) == eglSurface &&
        eglGetCurrentSurface(EGL_DRAW) == eglSurface) {
        return true;
    }

    const bool ok = eglMakeCurrent(m_eglDisplay, eglSurface, eglSurface, m_eglContext);
    if (ok) {
        if (!m_swapIntervalEnvChecked) {
            m_swapIntervalEnvChecked = true;
            if (qEnvironmentVariableIsSet("QT_QPA_EGLFS_SWAPINTERVAL")) {
                QByteArray swapIntervalString = qgetenv("QT_QPA_EGLFS_SWAPINTERVAL");
                bool intervalOk;
                const int swapInterval = swapIntervalString.toInt(&intervalOk);
                if (intervalOk)
                    m_swapIntervalFromEnv = swapInterval;
            }
        }
        const int requestedSwapInterval = m_swapIntervalFromEnv >= 0
            ? m_swapIntervalFromEnv
            : surface->format().swapInterval();
        if (requestedSwapInterval >= 0 && m_swapInterval != requestedSwapInterval) {
            m_swapInterval = requestedSwapInterval;
            if (eglSurface != EGL_NO_SURFACE) // skip if using surfaceless context
                eglSwapInterval(eglDisplay(), m_swapInterval);
        }
#if defined(Q_OS_VXWORKS) && defined(Q_PROCESSOR_X86_64)
        // Clear set of framebuffers as workaround for display artifacts found
        // in Wind River's Mesa OpenGL implementation
        static bool firstWindow = true;
        if (firstWindow && (QSurface::Window == surface->surface()->surfaceClass())) {
            glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
            swapBuffers(surface);
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
            swapBuffers(surface);
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
            swapBuffers(surface);
            firstWindow = false;
        }
#endif
    } else {
        qWarning("QEGLPlatformContext: eglMakeCurrent failed: %x", eglGetError());
    }

    return ok;
}